

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall pstore::small_vector<int,_4UL>::small_vector(small_vector<int,_4UL> *this)

{
  array<int,_4UL> *local_18;
  small_vector<int,_4UL> *this_local;
  
  this->elements_ = 0;
  local_18 = &this->small_buffer_;
  do {
    local_18->_M_elems[0] = 0;
    local_18 = (array<int,_4UL> *)(local_18->_M_elems + 1);
  } while ((vector<int,_std::allocator<int>_> *)local_18 != &this->big_buffer_);
  std::vector<int,_std::allocator<int>_>::vector(&this->big_buffer_);
  this->buffer_ = (int *)0x0;
  set_buffer_ptr(this,this->elements_);
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector () noexcept {
        this->set_buffer_ptr (elements_);
    }